

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::ScanLineInputFile::setFrameBuffer(ScanLineInputFile *this,FrameBuffer *frameBuffer)

{
  element_type *peVar1;
  pointer pSVar2;
  const_iterator cVar3;
  ConstIterator CVar4;
  exr_attr_chlist_entry_t *peVar5;
  ostream *poVar6;
  char *pcVar7;
  ArgExc *this_00;
  mutex *__mutex;
  stringstream _iex_throw_s;
  ostream local_1a8 [376];
  
  __mutex = &((this->_data).
              super___shared_ptr<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_mx;
  std::mutex::lock(__mutex);
  peVar1 = (this->_data).
           super___shared_ptr<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pSVar2 = (peVar1->fill_list).super__Vector_base<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((peVar1->fill_list).super__Vector_base<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_>.
      _M_impl.super__Vector_impl_data._M_finish != pSVar2) {
    (peVar1->fill_list).super__Vector_base<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar2;
  }
  cVar3._M_node = (_Base_ptr)FrameBuffer::begin(frameBuffer);
  do {
    CVar4 = FrameBuffer::end(frameBuffer);
    peVar1 = (this->_data).
             super___shared_ptr<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if ((const_iterator)cVar3._M_node == CVar4._i._M_node) {
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::operator=((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&peVar1->frameBuffer,
                  (_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)frameBuffer);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return;
    }
    peVar5 = Context::findChannel(&this->_ctxt,peVar1->partNumber,(char *)(cVar3._M_node + 1));
    if (peVar5 == (exr_attr_chlist_entry_t *)0x0) {
      std::vector<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_>::push_back
                (&((this->_data).
                   super___shared_ptr<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->fill_list,(value_type *)(cVar3._M_node + 9));
    }
    else if ((peVar5->x_sampling != cVar3._M_node[10]._M_color) ||
            (peVar5->y_sampling != *(int *)&cVar3._M_node[10].field_0x4)) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
      poVar6 = std::operator<<(local_1a8,"X and/or y subsampling factors of \"");
      poVar6 = std::operator<<(poVar6,(char *)(cVar3._M_node + 1));
      poVar6 = std::operator<<(poVar6,"\" channel of input file \"");
      pcVar7 = Context::fileName(&this->_ctxt);
      poVar6 = std::operator<<(poVar6,pcVar7);
      std::operator<<(poVar6,"\" are not compatible with the frame buffer\'s subsampling factors.");
      this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(this_00,(stringstream *)&_iex_throw_s);
      __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    cVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar3._M_node);
  } while( true );
}

Assistant:

void
ScanLineInputFile::setFrameBuffer (const FrameBuffer& frameBuffer)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (_data->_mx);
#endif
    _data->fill_list.clear ();

    for (FrameBuffer::ConstIterator j = frameBuffer.begin ();
         j != frameBuffer.end ();
         ++j)
    {
        const exr_attr_chlist_entry_t* curc = _ctxt.findChannel (
            _data->partNumber, j.name ());

        if (!curc)
        {
            _data->fill_list.push_back (j.slice ());
            continue;
        }

        if (curc->x_sampling != j.slice ().xSampling ||
            curc->y_sampling != j.slice ().ySampling)
            THROW (
                IEX_NAMESPACE::ArgExc,
                "X and/or y subsampling factors "
                "of \""
                    << j.name ()
                    << "\" channel "
                       "of input file \""
                    << fileName ()
                    << "\" are "
                       "not compatible with the frame buffer's "
                       "subsampling factors.");
    }

    _data->frameBuffer = frameBuffer;
}